

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reductors.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_kneip::groebnerRow47_000000000_f
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix,int targetRow)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  
  lVar39 = (long)targetRow;
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x207c];
  auVar38._8_8_ = 0x8000000000000000;
  auVar38._0_8_ = 0x8000000000000000;
  auVar40 = vxorpd_avx512vl(auVar41,auVar38);
  auVar42._0_8_ =
       auVar40._0_8_ /
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x20ab];
  auVar42._8_8_ = auVar40._8_8_;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x207c] = 0.0;
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x212f];
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2100];
  auVar40 = vfmadd213sd_fma(auVar43,auVar42,auVar40);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2100] = auVar40._0_8_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2171];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x2142];
  auVar40 = vfmadd213sd_fma(auVar44,auVar42,auVar1);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2142] = auVar40._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x21f5];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x21c6];
  auVar40 = vfmadd213sd_fma(auVar45,auVar42,auVar2);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x21c6] = auVar40._0_8_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2237];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x2208];
  auVar40 = vfmadd213sd_fma(auVar46,auVar42,auVar3);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2208] = auVar40._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2279];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x224a];
  auVar40 = vfmadd213sd_fma(auVar47,auVar42,auVar4);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x224a] = auVar40._0_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x22bb];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x228c];
  auVar40 = vfmadd213sd_fma(auVar48,auVar42,auVar5);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x228c] = auVar40._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x22fd];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x22ce];
  auVar40 = vfmadd213sd_fma(auVar49,auVar42,auVar6);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x22ce] = auVar40._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x233f];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x2310];
  auVar40 = vfmadd213sd_fma(auVar50,auVar42,auVar7);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2310] = auVar40._0_8_;
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2381];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x2352];
  auVar40 = vfmadd213sd_fma(auVar51,auVar42,auVar8);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2352] = auVar40._0_8_;
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x23c3];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                 ).m_storage.m_data.array[lVar39 + 0x2394];
  auVar40 = vfmadd213sd_fma(auVar52,auVar42,auVar9);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2394] = auVar40._0_8_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2405];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x23d6];
  auVar40 = vfmadd213sd_fma(auVar53,auVar42,auVar10);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x23d6] = auVar40._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2447];
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2418];
  auVar40 = vfmadd213sd_fma(auVar54,auVar42,auVar11);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2418] = auVar40._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2489];
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x245a];
  auVar40 = vfmadd213sd_fma(auVar55,auVar42,auVar12);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x245a] = auVar40._0_8_;
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c03];
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2bd4];
  auVar40 = vfmadd213sd_fma(auVar56,auVar42,auVar13);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2bd4] = auVar40._0_8_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c45];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2c16];
  auVar40 = vfmadd213sd_fma(auVar57,auVar42,auVar14);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2c16] = auVar40._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2cc9];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2c9a];
  auVar40 = vfmadd213sd_fma(auVar58,auVar42,auVar15);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2c9a] = auVar40._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d0b];
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2cdc];
  auVar40 = vfmadd213sd_fma(auVar59,auVar42,auVar16);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2cdc] = auVar40._0_8_;
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d8f];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2d60];
  auVar40 = vfmadd213sd_fma(auVar60,auVar42,auVar17);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2d60] = auVar40._0_8_;
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2dd1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2da2];
  auVar40 = vfmadd213sd_fma(auVar61,auVar42,auVar18);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2da2] = auVar40._0_8_;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e13];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2de4];
  auVar40 = vfmadd213sd_fma(auVar62,auVar42,auVar19);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2de4] = auVar40._0_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e55];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2e26];
  auVar40 = vfmadd213sd_fma(auVar63,auVar42,auVar20);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2e26] = auVar40._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e97];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2e68];
  auVar40 = vfmadd213sd_fma(auVar64,auVar42,auVar21);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2e68] = auVar40._0_8_;
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ed9];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2eaa];
  auVar40 = vfmadd213sd_fma(auVar65,auVar42,auVar22);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2eaa] = auVar40._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f1b];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2eec];
  auVar40 = vfmadd213sd_fma(auVar66,auVar42,auVar23);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2eec] = auVar40._0_8_;
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f5d];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2f2e];
  auVar40 = vfmadd213sd_fma(auVar67,auVar42,auVar24);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2f2e] = auVar40._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f9f];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2f70];
  auVar40 = vfmadd213sd_fma(auVar68,auVar42,auVar25);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2f70] = auVar40._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fe1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2fb2];
  auVar40 = vfmadd213sd_fma(auVar69,auVar42,auVar26);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2fb2] = auVar40._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3023];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x2ff4];
  auVar40 = vfmadd213sd_fma(auVar70,auVar42,auVar27);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x2ff4] = auVar40._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3065];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x3036];
  auVar40 = vfmadd213sd_fma(auVar71,auVar42,auVar28);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x3036] = auVar40._0_8_;
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30a7];
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x3078];
  auVar40 = vfmadd213sd_fma(auVar72,auVar42,auVar29);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x3078] = auVar40._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30e9];
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x30ba];
  auVar40 = vfmadd213sd_fma(auVar73,auVar42,auVar30);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x30ba] = auVar40._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x312b];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x30fc];
  auVar40 = vfmadd213sd_fma(auVar74,auVar42,auVar31);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x30fc] = auVar40._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x316d];
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x313e];
  auVar40 = vfmadd213sd_fma(auVar75,auVar42,auVar32);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x313e] = auVar40._0_8_;
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31af];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x3180];
  auVar40 = vfmadd213sd_fma(auVar76,auVar42,auVar33);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x3180] = auVar40._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31f1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x31c2];
  auVar40 = vfmadd213sd_fma(auVar77,auVar42,auVar34);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x31c2] = auVar40._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3233];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x3204];
  auVar40 = vfmadd213sd_fma(auVar78,auVar42,auVar35);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x3204] = auVar40._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3275];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x3246];
  auVar40 = vfmadd213sd_fma(auVar79,auVar42,auVar36);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x3246] = auVar40._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x32b7];
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[lVar39 + 0x3288];
  auVar40 = vfmadd213sd_fma(auVar80,auVar42,auVar37);
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[lVar39 + 0x3288] = auVar40._0_8_;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::groebnerRow47_000000000_f( Eigen::Matrix<double,66,197> & groebnerMatrix, int targetRow )
{
  double factor = groebnerMatrix(targetRow,126) / groebnerMatrix(47,126);
  groebnerMatrix(targetRow,126) = 0.0;
  groebnerMatrix(targetRow,128) -= factor * groebnerMatrix(47,128);
  groebnerMatrix(targetRow,129) -= factor * groebnerMatrix(47,129);
  groebnerMatrix(targetRow,131) -= factor * groebnerMatrix(47,131);
  groebnerMatrix(targetRow,132) -= factor * groebnerMatrix(47,132);
  groebnerMatrix(targetRow,133) -= factor * groebnerMatrix(47,133);
  groebnerMatrix(targetRow,134) -= factor * groebnerMatrix(47,134);
  groebnerMatrix(targetRow,135) -= factor * groebnerMatrix(47,135);
  groebnerMatrix(targetRow,136) -= factor * groebnerMatrix(47,136);
  groebnerMatrix(targetRow,137) -= factor * groebnerMatrix(47,137);
  groebnerMatrix(targetRow,138) -= factor * groebnerMatrix(47,138);
  groebnerMatrix(targetRow,139) -= factor * groebnerMatrix(47,139);
  groebnerMatrix(targetRow,140) -= factor * groebnerMatrix(47,140);
  groebnerMatrix(targetRow,141) -= factor * groebnerMatrix(47,141);
  groebnerMatrix(targetRow,170) -= factor * groebnerMatrix(47,170);
  groebnerMatrix(targetRow,171) -= factor * groebnerMatrix(47,171);
  groebnerMatrix(targetRow,173) -= factor * groebnerMatrix(47,173);
  groebnerMatrix(targetRow,174) -= factor * groebnerMatrix(47,174);
  groebnerMatrix(targetRow,176) -= factor * groebnerMatrix(47,176);
  groebnerMatrix(targetRow,177) -= factor * groebnerMatrix(47,177);
  groebnerMatrix(targetRow,178) -= factor * groebnerMatrix(47,178);
  groebnerMatrix(targetRow,179) -= factor * groebnerMatrix(47,179);
  groebnerMatrix(targetRow,180) -= factor * groebnerMatrix(47,180);
  groebnerMatrix(targetRow,181) -= factor * groebnerMatrix(47,181);
  groebnerMatrix(targetRow,182) -= factor * groebnerMatrix(47,182);
  groebnerMatrix(targetRow,183) -= factor * groebnerMatrix(47,183);
  groebnerMatrix(targetRow,184) -= factor * groebnerMatrix(47,184);
  groebnerMatrix(targetRow,185) -= factor * groebnerMatrix(47,185);
  groebnerMatrix(targetRow,186) -= factor * groebnerMatrix(47,186);
  groebnerMatrix(targetRow,187) -= factor * groebnerMatrix(47,187);
  groebnerMatrix(targetRow,188) -= factor * groebnerMatrix(47,188);
  groebnerMatrix(targetRow,189) -= factor * groebnerMatrix(47,189);
  groebnerMatrix(targetRow,190) -= factor * groebnerMatrix(47,190);
  groebnerMatrix(targetRow,191) -= factor * groebnerMatrix(47,191);
  groebnerMatrix(targetRow,192) -= factor * groebnerMatrix(47,192);
  groebnerMatrix(targetRow,193) -= factor * groebnerMatrix(47,193);
  groebnerMatrix(targetRow,194) -= factor * groebnerMatrix(47,194);
  groebnerMatrix(targetRow,195) -= factor * groebnerMatrix(47,195);
  groebnerMatrix(targetRow,196) -= factor * groebnerMatrix(47,196);
}